

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O0

TPZSkylMatrix<std::complex<double>_> * __thiscall
TPZSkylMatrix<std::complex<double>_>::NewMatrix(TPZSkylMatrix<std::complex<double>_> *this)

{
  TPZSkylMatrix<std::complex<double>_> *pTVar1;
  TPZSkylMatrix<std::complex<double>_> *in_stack_00000010;
  
  pTVar1 = (TPZSkylMatrix<std::complex<double>_> *)operator_new(0x60);
  TPZSkylMatrix(in_stack_00000010);
  return pTVar1;
}

Assistant:

inline TPZSkylMatrix<TVar>*NewMatrix() const override {return new TPZSkylMatrix<TVar>{};}